

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_count.cpp
# Opt level: O2

void duckdb::ApproxCountDistinctSimpleUpdateFunction
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,data_ptr_t state,
               idx_t count)

{
  InternalException *this;
  allocator local_a9;
  LogicalType local_a8;
  Vector hash_vec;
  
  if (count < 0x801) {
    LogicalType::LogicalType(&local_a8,UBIGINT);
    Vector::Vector(&hash_vec,&local_a8,count);
    LogicalType::~LogicalType(&local_a8);
    VectorOperations::Hash(inputs,&hash_vec,count);
    HyperLogLog::Update((HyperLogLog *)state,inputs,&hash_vec,count);
    Vector::~Vector(&hash_vec);
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&hash_vec,"ApproxCountDistinct - count must be at most vector size",&local_a9
            );
  InternalException::InternalException(this,(string *)&hash_vec);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void ApproxCountDistinctSimpleUpdateFunction(Vector inputs[], AggregateInputData &, idx_t input_count,
                                                    data_ptr_t state, idx_t count) {
	D_ASSERT(input_count == 1);
	auto &input = inputs[0];

	if (count > STANDARD_VECTOR_SIZE) {
		throw InternalException("ApproxCountDistinct - count must be at most vector size");
	}
	Vector hash_vec(LogicalType::HASH, count);
	VectorOperations::Hash(input, hash_vec, count);

	auto agg_state = reinterpret_cast<ApproxDistinctCountState *>(state);
	agg_state->hll.Update(input, hash_vec, count);
}